

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

int xfwd_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  Channel *chan_00;
  Socket *s_00;
  char *pcVar1;
  SocketPeerInfo *pi_00;
  SshChannel *sc;
  char *err;
  SocketPeerInfo *pi;
  Socket *s;
  Channel *chan;
  Plug *plug;
  sesschan *sess;
  accept_fn_t constructor_local;
  Plug *p_local;
  accept_ctx_t ctx_local;
  
  plug = p + -0xad;
  sess = (sesschan *)constructor;
  constructor_local = (accept_fn_t)p;
  p_local = (Plug *)ctx;
  chan_00 = portfwd_raw_new((ConnectionLayer *)plug->vt->closing,(Plug **)&chan,false);
  s_00 = (Socket *)(*(code *)sess)(p_local,chan);
  pcVar1 = sk_socket_error(s_00);
  if (pcVar1 == (char *)0x0) {
    pi_00 = sk_peer_info(s_00);
    sc = ssh_serverside_x11_open((ConnectionLayer *)plug->vt->closing,chan_00,pi_00);
    portfwd_raw_setup(chan_00,s_00,sc);
    sk_free_peer_info(pi_00);
  }
  else {
    portfwd_raw_free(chan_00);
  }
  ctx_local._5_3_ = 0;
  ctx_local._4_1_ = pcVar1 != (char *)0x0;
  return ctx_local._4_4_;
}

Assistant:

static int xfwd_accepting(Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    sesschan *sess = container_of(p, sesschan, xfwd_plug);
    Plug *plug;
    Channel *chan;
    Socket *s;
    SocketPeerInfo *pi;
    const char *err;

    chan = portfwd_raw_new(sess->c->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }
    pi = sk_peer_info(s);
    portfwd_raw_setup(chan, s, ssh_serverside_x11_open(sess->c->cl, chan, pi));
    sk_free_peer_info(pi);

    return 0;
}